

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

pointer __thiscall
google::
dense_hashtable<const_char_*,_const_char_*,_std::hash<const_char_*>,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::Identity,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::SetKey,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
::alloc_impl<google::libc_allocator_with_realloc<const_char_*>_>::realloc_or_die
          (alloc_impl<google::libc_allocator_with_realloc<const_char_*>_> *this,pointer ptr,
          size_type n)

{
  pointer ppcVar1;
  long lVar2;
  pointer ppcVar3;
  ulong uVar4;
  char *pcVar5;
  
  ppcVar1 = (pointer)realloc(ptr,n * 8);
  if (ppcVar1 != (pointer)0x0) {
    return ppcVar1;
  }
  dense_hashtable<char_const*,char_const*,std::hash<char_const*>,google::dense_hash_set<char_const*,std::hash<char_const*>,std::equal_to<char_const*>,google::libc_allocator_with_realloc<char_const*>>::Identity,google::dense_hash_set<char_const*,std::hash<char_const*>,std::equal_to<char_const*>,google::libc_allocator_with_realloc<char_const*>>::SetKey,std::equal_to<char_const*>,google::libc_allocator_with_realloc<char_const*>>
  ::alloc_impl<google::libc_allocator_with_realloc<char_const*>>::realloc_or_die();
  uVar4 = *(long *)(n + 0x40) - 1;
  ppcVar1 = (pointer)((ulong)*ptr >> 3 & uVar4);
  pcVar5 = *(char **)(*(long *)(n + 0x50) + (long)ppcVar1 * 8);
  if (*(char **)(n + 0x28) != pcVar5) {
    ppcVar3 = (pointer)0xffffffffffffffff;
    lVar2 = 1;
    do {
      if ((*(long *)(n + 0x30) == 0) || (*(char **)(n + 0x20) != pcVar5)) {
        if (*ptr == pcVar5) {
          return ppcVar1;
        }
      }
      else if (ppcVar3 == (pointer)0xffffffffffffffff) {
        ppcVar3 = ppcVar1;
      }
      ppcVar1 = (pointer)((long)ppcVar1 + lVar2 & uVar4);
      pcVar5 = *(char **)(*(long *)(n + 0x50) + (long)ppcVar1 * 8);
      lVar2 = lVar2 + 1;
    } while (*(char **)(n + 0x28) != pcVar5);
  }
  return (pointer)0xffffffffffffffff;
}

Assistant:

pointer realloc_or_die(pointer ptr, size_type n) {
      pointer retval = this->reallocate(ptr, n);
      if (retval == NULL) {
        fprintf(stderr,
                "sparsehash: FATAL ERROR: failed to reallocate "
                "%lu elements for ptr %p",
                static_cast<unsigned long>(n), static_cast<void*>(ptr));
        exit(1);
      }
      return retval;
    }